

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::ShaderModule>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters *params)

{
  string local_a8;
  Resources res;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_78;
  Environment env;
  
  Environment::Environment(&env,(Context *)this,1);
  res.binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                         (env.programBinaries,(string *)&context->m_platformInterface);
  ShaderModule::create((Move<vk::Handle<(vk::HandleType)14>_> *)&local_78,&env,&res,params);
  local_a8.field_2._M_allocated_capacity = (size_type)local_78.m_data.deleter.m_device;
  local_a8.field_2._8_8_ = local_78.m_data.deleter.m_allocator;
  local_a8._M_dataplus._M_p = (pointer)local_78.m_data.object.m_internal;
  local_a8._M_string_length = (size_type)local_78.m_data.deleter.m_deviceIface;
  local_78.m_data.object.m_internal = 0;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Ok",(allocator<char> *)&local_78);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}